

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf-parser.cc
# Opt level: O3

string * __thiscall
elf_parser::Elf_parser::get_rel_symbol_name_abi_cxx11_
          (string *__return_storage_ptr__,Elf_parser *this,uint64_t *sym_idx,
          vector<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_> *syms)

{
  pointer paVar1;
  pointer paVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  paVar2 = (syms->super__Vector_base<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_>).
           _M_impl.super__Vector_impl_data._M_start;
  paVar1 = (syms->super__Vector_base<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (paVar2 != paVar1) {
    do {
      if ((ulong)*(uint *)((long)sym_idx + 4) == (long)paVar2->symbol_num) {
        std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      paVar2 = paVar2 + 1;
    } while (paVar2 != paVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Elf_parser::get_rel_symbol_name(
                uint64_t &sym_idx, std::vector<symbol_t> &syms) {

    std::string sym_name;
    for(auto &sym: syms) {
        if(sym.symbol_num == ELF64_R_SYM(sym_idx)) {
            sym_name = sym.symbol_name;
            break;
        }
    }
    return sym_name;
}